

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O1

void ncnn::convdw3x3s2_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  float fVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  void *pvVar15;
  void *pvVar16;
  void *pvVar17;
  ulong uVar18;
  pointer pfVar19;
  void *pvVar20;
  size_t sVar21;
  size_t sVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  uint uVar28;
  long lVar29;
  ulong uVar30;
  char *pcVar31;
  char *pcVar32;
  void *pvVar33;
  long lVar34;
  char *pcVar35;
  int iVar36;
  float *pfVar37;
  int iVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int size;
  
  auVar27 = _DAT_005f1660;
  auVar26 = _DAT_005f1640;
  iVar11 = top_blob->c;
  if (0 < (long)iVar11) {
    iVar12 = top_blob->w;
    iVar13 = top_blob->h;
    pvVar15 = _kernel->data;
    pvVar16 = _bias->data;
    iVar14 = bottom_blob->w;
    iVar25 = (iVar14 - iVar12) * 2;
    lVar34 = (long)top_blob->h * (long)top_blob->w;
    pvVar17 = top_blob->data;
    uVar18 = top_blob->elemsize;
    lVar29 = top_blob->cstep * uVar18;
    pfVar19 = (scales_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar36 = (int)((uVar18 * lVar34 + 0xf & 0xfffffffffffffff0) / uVar18);
    if (top_blob->dims == 4) {
      iVar36 = (int)lVar34;
    }
    uVar28 = iVar36 * top_blob->d;
    pvVar20 = bottom_blob->data;
    sVar21 = bottom_blob->cstep;
    sVar22 = bottom_blob->elemsize;
    lVar34 = 0;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = (ulong)uVar28 - 1;
    auVar39 = vpshufd_avx(auVar39,0x44);
    uVar18 = auVar39._0_8_;
    auVar40._0_8_ = uVar18 ^ 0x8000000000000000;
    auVar40._8_4_ = auVar39._8_4_;
    uVar23 = auVar39._12_4_;
    auVar40._12_4_ = uVar23 ^ 0x80000000;
    auVar39 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
    pvVar33 = pvVar17;
    do {
      if (pvVar16 == (void *)0x0) {
        auVar41 = ZEXT816(0) << 0x40;
      }
      else {
        auVar41 = ZEXT416(*(uint *)((long)pvVar16 + lVar34 * 4));
      }
      fVar7 = pfVar19[lVar34];
      if (0 < (int)uVar28) {
        auVar41 = vshufps_avx(auVar41,auVar41,0);
        auVar42._16_16_ = auVar41;
        auVar42._0_16_ = auVar41;
        uVar30 = 0;
        do {
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar30;
          auVar41 = vpshufd_avx(auVar41,0x44);
          auVar44._16_16_ = auVar41;
          auVar44._0_16_ = auVar41;
          auVar45 = vorps_avx(auVar44,auVar26);
          auVar44 = vorps_avx(auVar44,auVar27);
          auVar47._0_8_ = auVar44._16_8_ ^ 0x8000000000000000;
          auVar47._8_4_ = auVar44._24_4_;
          auVar47._12_4_ = auVar44._28_4_ ^ 0x80000000;
          auVar41 = vpcmpgtq_avx(auVar47,auVar40);
          auVar49._0_8_ = uVar18 ^ 0x8000000000000000;
          auVar49._8_4_ = auVar40._8_4_;
          auVar49._12_4_ = uVar23 ^ 0x80000000;
          auVar43._0_8_ = auVar44._0_8_ ^ 0x8000000000000000;
          auVar43._8_4_ = auVar44._8_4_;
          auVar43._12_4_ = auVar44._12_4_ ^ 0x80000000;
          auVar43 = vpcmpgtq_avx(auVar43,auVar49);
          auVar41 = vpackssdw_avx(auVar43,auVar41);
          auVar48._0_8_ = auVar45._16_8_ ^ 0x8000000000000000;
          auVar48._8_4_ = auVar45._24_4_;
          auVar48._12_4_ = auVar45._28_4_ ^ 0x80000000;
          auVar43 = vpcmpgtq_avx(auVar48,auVar40);
          auVar50._0_8_ = uVar18 ^ 0x8000000000000000;
          auVar50._8_4_ = auVar40._8_4_;
          auVar50._12_4_ = uVar23 ^ 0x80000000;
          auVar46._0_8_ = auVar45._0_8_ ^ 0x8000000000000000;
          auVar46._8_4_ = auVar45._8_4_;
          auVar46._12_4_ = auVar45._12_4_ ^ 0x80000000;
          auVar46 = vpcmpgtq_avx(auVar46,auVar50);
          auVar43 = vpackssdw_avx(auVar46,auVar43);
          auVar41 = vpackssdw_avx(auVar43 ^ auVar39,auVar41 ^ auVar39);
          auVar43 = vpmovsxwd_avx(auVar41);
          auVar41 = vpunpckhwd_avx(auVar41,auVar41);
          auVar45._16_16_ = auVar41;
          auVar45._0_16_ = auVar43;
          auVar45 = vmaskmovps_avx(auVar45,auVar42);
          *(undefined1 (*) [32])((long)pvVar33 + uVar30 * 4) = auVar45;
          uVar30 = uVar30 + 8;
        } while ((uVar28 + 7 & 0xfffffff8) != uVar30);
      }
      if (0 < iVar13) {
        pfVar37 = (float *)(lVar29 * lVar34 + (long)pvVar17);
        lVar24 = lVar34 * 9;
        pcVar35 = (char *)(sVar21 * sVar22 * lVar34 + (long)pvVar20);
        pcVar32 = pcVar35 + (long)iVar14 * 2;
        pcVar31 = pcVar35 + iVar14;
        iVar36 = 0;
        do {
          iVar38 = iVar12 + 1;
          if (0 < iVar12) {
            do {
              cVar8 = *pcVar35;
              pcVar1 = pcVar35 + 1;
              pcVar2 = pcVar35 + 2;
              pcVar35 = pcVar35 + 2;
              cVar9 = *pcVar31;
              pcVar3 = pcVar31 + 1;
              pcVar4 = pcVar31 + 2;
              pcVar31 = pcVar31 + 2;
              cVar10 = *pcVar32;
              pcVar5 = pcVar32 + 1;
              pcVar6 = pcVar32 + 2;
              pcVar32 = pcVar32 + 2;
              *pfVar37 = fVar7 * (float)((int)*(char *)((long)pvVar15 + lVar24 + 8) * (int)*pcVar6 +
                                         (int)*(char *)((long)pvVar15 + lVar24 + 7) * (int)*pcVar5 +
                                        (int)*(char *)((long)pvVar15 + lVar24 + 6) * (int)cVar10 +
                                        (int)*(char *)((long)pvVar15 + lVar24 + 5) * (int)*pcVar4 +
                                        (int)*(char *)((long)pvVar15 + lVar24 + 4) * (int)*pcVar3 +
                                        (int)*(char *)((long)pvVar15 + lVar24 + 3) * (int)cVar9 +
                                        (int)*(char *)((long)pvVar15 + lVar24 + 2) * (int)*pcVar2 +
                                        (int)*(char *)((long)pvVar15 + lVar24 + 1) * (int)*pcVar1 +
                                        (int)*(char *)((long)pvVar15 + lVar24) * (int)cVar8) +
                         *pfVar37;
              pfVar37 = pfVar37 + 1;
              iVar38 = iVar38 + -1;
            } while (1 < iVar38);
          }
          pcVar35 = pcVar35 + iVar25;
          pcVar31 = pcVar31 + iVar25;
          pcVar32 = pcVar32 + iVar25;
          iVar36 = iVar36 + 1;
        } while (iVar36 != iVar13);
      }
      lVar34 = lVar34 + 1;
      pvVar33 = (void *)((long)pvVar33 + lVar29);
    } while (lVar34 != iVar11);
  }
  return;
}

Assistant:

static void convdw3x3s2_int8_dequant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, std::vector<float> scales_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        float* outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_dequant = scales_dequant[p];

        out.fill(bias0);

        const signed char* kernel0 = (const signed char*)kernel + p * 9;

        const signed char* img0 = bottom_blob.channel(p);
        const signed char* r0 = img0;
        const signed char* r1 = img0 + w;
        const signed char* r2 = img0 + w * 2;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += (float)sum * scale_dequant;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}